

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_gri(ASMState *as,x86Group xg,Reg rb,int32_t i)

{
  MCode *pMVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  x86Op xo;
  MCode *p;
  int32_t i_local;
  Reg rb_local;
  x86Group xg_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  byte *local_20;
  byte *local_8;
  
  pMVar1 = as->mcp;
  if (i == (char)(MCode)i) {
    p = pMVar1 + -1;
    pMVar1[-1] = (MCode)i;
    iVar2 = (xg & 0xff0000) * 0x100;
  }
  else {
    p = pMVar1 + -4;
    *(int32_t *)p = i;
    iVar2 = (xg & 0xff00) * 0x10000;
  }
  xo = iVar2 + 0xfe;
  p[-1] = (char)((xg & 7) << 3) + -0x40 + ((byte)rb & 7);
  iVar2 = (int)(char)xo;
  if (iVar2 == -0x3c) {
    *(x86Op *)(p + -5) = (rb >> 3 & 1) * 0x2000 ^ xo;
    local_8 = p + -5;
  }
  else {
    *(x86Op *)(p + -5) = xo;
    pbVar4 = p + iVar2;
    iVar3 = ((rb & 0x80200) >> 1 & 0x104) + 0x40 + (rb >> 3 & 1);
    local_20 = pbVar4;
    if (iVar3 != 0x40) {
      rex._0_1_ = (byte)((rb & 0x80200) >> 0x10) | (byte)iVar3;
      if (iVar2 == -4) {
        *pbVar4 = (byte)rex;
        rex._0_1_ = (byte)(xo >> 8);
      }
      else if ((xo & 0xffffff) == 0x6600fd) {
        *pbVar4 = (byte)rex;
        rex._0_1_ = 0x66;
      }
      local_20 = pbVar4 + -1;
      pbVar4[-1] = (byte)rex;
    }
    local_8 = local_20;
  }
  as->mcp = local_8;
  return;
}

Assistant:

static void emit_gri(ASMState *as, x86Group xg, Reg rb, int32_t i)
{
  MCode *p = as->mcp;
  x86Op xo;
  if (checki8(i)) {
    *--p = (MCode)i;
    xo = XG_TOXOi8(xg);
  } else {
    p -= 4;
    *(int32_t *)p = i;
    xo = XG_TOXOi(xg);
  }
  as->mcp = emit_opm(xo, XM_REG, (Reg)(xg & 7) | (rb & REX_64), rb, p, 0);
}